

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUCache.hpp
# Opt level: O1

node * __thiscall
sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
::load(LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       *this,locType *offset)

{
  Node *pNVar1;
  long lVar2;
  CacheNode *pCVar3;
  Node *pNVar4;
  CacheNode *__dest;
  CacheNode *pCVar5;
  CacheNode **ppCVar6;
  node ret;
  value_type local_690;
  pair<sjtu::map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>::iterator,_bool>
  local_680;
  undefined1 local_668 [1608];
  
  this->attempt_count = this->attempt_count + 1;
  pNVar1 = (this->table).nil;
  pNVar4 = pNVar1->left;
  if (pNVar4 != pNVar1) {
    do {
      lVar2 = pNVar4->value->first;
      if (lVar2 == *offset) break;
      pNVar4 = (&pNVar4->left)[lVar2 <= *offset];
    } while (pNVar4 != pNVar1);
  }
  if (pNVar4 == pNVar1) {
    this->miss_count = this->miss_count + 1;
    __dest = (CacheNode *)operator_new(0x670);
    memset(local_668,0,0x648);
    std::istream::seekg(this->file,*offset,0);
    std::istream::read((char *)this->file,(long)local_668);
    memcpy(__dest,local_668,0x648);
    local_690.first = *offset;
    __dest->offset = local_690.first;
    __dest->is_dirty_page = false;
    __dest->prec = (CacheNode *)0x0;
    __dest->succ = (CacheNode *)0x0;
    __dest->bel = this;
    local_690.second = __dest;
    map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
    ::insert(&local_680,&this->table,&local_690);
    if (this->block_lim == (this->table).tot) {
      pCVar5 = this->tail;
      pCVar3 = pCVar5->prec;
      this->tail = pCVar3;
      ppCVar6 = &pCVar3->succ;
      if (pCVar3 == (CacheNode *)0x0) {
        ppCVar6 = &this->head;
      }
      *ppCVar6 = (CacheNode *)0x0;
      if (pCVar5 != (CacheNode *)0x0) {
        CacheNode::~CacheNode(pCVar5);
        operator_delete(pCVar5,0x670);
      }
    }
    pCVar5 = this->head;
    if (pCVar5 == (CacheNode *)0x0) {
      this->tail = __dest;
      goto LAB_00115b52;
    }
  }
  else {
    __dest = pNVar4->value->second;
    pCVar5 = this->head;
    if (__dest == pCVar5) {
      return &__dest->value;
    }
    pCVar3 = __dest->prec;
    pCVar3->succ = __dest->succ;
    ppCVar6 = &__dest->succ->prec;
    if (__dest->succ == (CacheNode *)0x0) {
      ppCVar6 = &this->tail;
    }
    *ppCVar6 = pCVar3;
    __dest->prec = (CacheNode *)0x0;
  }
  __dest->succ = pCVar5;
  pCVar5->prec = __dest;
LAB_00115b52:
  this->head = __dest;
  return &__dest->value;
}

Assistant:

valueType *load(const locType &offset)
		{
			++ attempt_count;
			typename map<locType , CacheNode*>::iterator it = table.find(offset);
			CacheNode *node;
			if (it == table.end())
			{
				++ miss_count;
				node = new CacheNode (f_read(offset) , offset , this);
				if (block_lim == table.size())
				{
					CacheNode *tmp = tail;
					if (tail = tail -> prec) tail -> succ = nullptr;
					else  head = nullptr;
					delete tmp;
				}
				if (head == nullptr) head = tail = node;
				else (node -> succ = head) -> prec = node , head = node;
			}
			else
			{
				node = it -> second;
				if (node != head)
				{
					node -> prec -> succ = node -> succ;
					if (node -> succ) node -> succ -> prec = node -> prec;
					else tail = node -> prec;
					node -> prec = nullptr , (node -> succ = head) -> prec = node , head = node;
				}
			}
			return &(node -> value);
		}